

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_subi_8_di(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = m68ki_read_imm_8();
  uVar3 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  uVar2 = m68ki_read_imm_16();
  uVar3 = (int)(short)uVar2 + uVar3;
  uVar2 = m68ki_read_8_fc(uVar3,m68ki_address_space | m68ki_cpu.s_flag);
  m68ki_cpu.x_flag = uVar2 - uVar1;
  m68ki_cpu.not_z_flag = m68ki_cpu.x_flag & 0xff;
  m68ki_cpu.v_flag = (m68ki_cpu.x_flag ^ uVar2) & (uVar1 ^ uVar2);
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_8_fc(uVar3,m68ki_cpu.s_flag | 1,m68ki_cpu.not_z_flag);
  return;
}

Assistant:

static void m68k_op_subi_8_di(void)
{
	uint src = OPER_I_8();
	uint ea = EA_AY_DI_8();
	uint dst = m68ki_read_8(ea);
	uint res = dst - src;

	FLAG_N = NFLAG_8(res);
	FLAG_Z = MASK_OUT_ABOVE_8(res);
	FLAG_X = FLAG_C = CFLAG_8(res);
	FLAG_V = VFLAG_SUB_8(src, dst, res);

	m68ki_write_8(ea, FLAG_Z);
}